

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int eval_additive_expr(lyxp_expr *exp,uint16_t *exp_idx,lyd_node *cur_node,lys_module *param_4,
                      lyxp_set *set,int options)

{
  uint uVar1;
  uint8_t *puVar2;
  byte bVar3;
  bool bVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  char *pcVar8;
  ushort uVar9;
  ushort uVar10;
  char *pcVar11;
  long lVar12;
  lyxp_set *set_00;
  undefined1 auStack_c8 [8];
  lyxp_set orig_set;
  lyxp_set set2;
  
  auStack_c8 = (undefined1  [8])0x0;
  orig_set.type = LYXP_SET_EMPTY;
  orig_set._4_4_ = 0;
  orig_set._8_8_ = 0;
  orig_set.val.nodes = (lyxp_set_nodes *)0x0;
  orig_set.val._8_8_ = 0;
  orig_set.used = 0;
  orig_set.size = 0;
  orig_set.ctx_pos = 0;
  orig_set.ctx_size = 0;
  puVar2 = exp->repeat[*exp_idx];
  if (puVar2 == (uint8_t *)0x0) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    do {
      uVar5 = uVar9;
      uVar9 = uVar5 + 1;
    } while (puVar2[(ulong)uVar5 + 1] != '\0');
    uVar9 = (ushort)puVar2[uVar5];
  }
  bVar3 = 1;
  if (((uVar9 != 0) && (exp->tokens[uVar9] == LYXP_TOKEN_OPERATOR_MATH)) &&
     ((exp->expr[exp->expr_pos[uVar9]] == '-' || (exp->expr[exp->expr_pos[uVar9]] == '+')))) {
    exp_repeat_pop(exp,*exp_idx);
    set_fill_set((lyxp_set *)auStack_c8,set);
    bVar3 = 0;
  }
  iVar7 = eval_multiplicative_expr(exp,exp_idx,cur_node,param_4,set,options);
  if (!(bool)(iVar7 != 0 | bVar3)) {
    pcVar11 = "parsed";
    if (set == (lyxp_set *)0x0) {
      pcVar11 = "skipped";
    }
    do {
      uVar9 = *exp_idx;
      if ('\x02' < ly_log_level) {
        pcVar8 = print_token(exp->tokens[uVar9]);
        ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_additive_expr",pcVar11,pcVar8,
                   (ulong)exp->expr_pos[*exp_idx]);
      }
      uVar5 = *exp_idx + 1;
      *exp_idx = uVar5;
      puVar2 = exp->repeat[uVar5];
      if (puVar2 == (uint8_t *)0x0) {
        uVar6 = 0;
      }
      else {
        uVar6 = 0;
        do {
          uVar10 = uVar6;
          uVar6 = uVar10 + 1;
        } while (puVar2[(ulong)uVar10 + 1] != '\0');
        uVar6 = (ushort)puVar2[uVar10];
      }
      bVar4 = true;
      if (((uVar6 != 0) && (exp->tokens[uVar6] == LYXP_TOKEN_OPERATOR_MATH)) &&
         ((exp->expr[exp->expr_pos[uVar6]] == '-' || (exp->expr[exp->expr_pos[uVar6]] == '+')))) {
        exp_repeat_pop(exp,uVar5);
        bVar4 = false;
      }
      if (set == (lyxp_set *)0x0) {
        iVar7 = eval_multiplicative_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)0x0,options);
        if (iVar7 != 0) {
          return iVar7;
        }
      }
      else {
        set_fill_set((lyxp_set *)&orig_set.ctx_pos,(lyxp_set *)auStack_c8);
        iVar7 = eval_multiplicative_expr
                          (exp,exp_idx,cur_node,param_4,(lyxp_set *)&orig_set.ctx_pos,options);
        if (iVar7 != 0) {
LAB_0016af18:
          lyxp_set_cast((lyxp_set *)auStack_c8,LYXP_SET_EMPTY,cur_node,param_4,options);
          set_00 = (lyxp_set *)&orig_set.ctx_pos;
          goto LAB_0016af39;
        }
        if ((options & 0x1cU) == 0) {
          iVar7 = moveto_op_math(set,(lyxp_set *)&orig_set.ctx_pos,exp->expr + exp->expr_pos[uVar9],
                                 cur_node,param_4,options);
          if (iVar7 != 0) {
            iVar7 = -1;
            goto LAB_0016af18;
          }
        }
        else {
          set_snode_merge(set,(lyxp_set *)&orig_set.ctx_pos);
          uVar1 = set->used;
          if ((ulong)uVar1 != 0) {
            lVar12 = 0;
            do {
              if (*(int *)((long)&((set->val).nodes)->pos + lVar12) == 1) {
                *(undefined4 *)((long)&((set->val).nodes)->pos + lVar12) = 0;
              }
              lVar12 = lVar12 + 0x10;
            } while ((ulong)uVar1 << 4 != lVar12);
          }
        }
      }
    } while (!bVar4);
    iVar7 = 0;
  }
  set_00 = (lyxp_set *)auStack_c8;
LAB_0016af39:
  lyxp_set_cast(set_00,LYXP_SET_EMPTY,cur_node,param_4,options);
  return iVar7;
}

Assistant:

static int
eval_additive_expr(struct lyxp_expr *exp, uint16_t *exp_idx, struct lyd_node *cur_node, struct lys_module *local_mod,
                   struct lyxp_set *set, int options)
{
    int ret;
    uint16_t this_op, op_exp;
    struct lyxp_set orig_set, set2;

    memset(&orig_set, 0, sizeof orig_set);
    memset(&set2, 0, sizeof set2);

    op_exp = exp_repeat_peek(exp, *exp_idx);
    if (op_exp && (exp->tokens[op_exp] == LYXP_TOKEN_OPERATOR_MATH)
            && ((exp->expr[exp->expr_pos[op_exp]] == '+') || (exp->expr[exp->expr_pos[op_exp]] == '-'))) {
        /* there is an operator */
        exp_repeat_pop(exp, *exp_idx);
        set_fill_set(&orig_set, set);
    } else {
        op_exp = 0;
    }

    /* MultiplicativeExpr */
    ret = eval_multiplicative_expr(exp, exp_idx, cur_node, local_mod, set, options);
    if (ret) {
        lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
        return ret;
    }

    /* ('+' / '-' MultiplicativeExpr)* */
    while (op_exp) {
        this_op = *exp_idx;

        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

        op_exp = exp_repeat_peek(exp, *exp_idx);
        if (op_exp && (exp->tokens[op_exp] == LYXP_TOKEN_OPERATOR_MATH)
                && ((exp->expr[exp->expr_pos[op_exp]] == '+') || (exp->expr[exp->expr_pos[op_exp]] == '-'))) {
            /* there is another operator */
            exp_repeat_pop(exp, *exp_idx);
        } else {
            op_exp = 0;
        }

        if (!set) {
            ret = eval_multiplicative_expr(exp, exp_idx, cur_node, local_mod, NULL, options);
            if (ret) {
                return ret;
            }
            continue;
        }

        set_fill_set(&set2, &orig_set);
        ret = eval_multiplicative_expr(exp, exp_idx, cur_node, local_mod, &set2, options);
        if (ret) {
            lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
            lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
            return ret;
        }

        /* eval */
        if (options & LYXP_SNODE_ALL) {
            set_snode_merge(set, &set2);
            set_snode_clear_ctx(set);
        } else {
            if (moveto_op_math(set, &set2, &exp->expr[exp->expr_pos[this_op]], cur_node, local_mod, options)) {
                lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
                lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
                return -1;
            }
        }
    }

    lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
    return EXIT_SUCCESS;
}